

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

block_state deflate_stored(deflate_state *s,int flush)

{
  uInt uVar1;
  uInt uVar2;
  uInt uVar3;
  bool bVar4;
  z_streamp pzVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  block_state bVar11;
  ulong __n;
  uint uVar12;
  uint uVar13;
  
  uVar9 = s->pending_buf_size - 5;
  uVar12 = (uint)uVar9;
  if (s->w_size < uVar9) {
    uVar12 = s->w_size;
  }
  uVar1 = s->strm->avail_in;
  do {
    uVar7 = s->bi_valid + 0x2a >> 3;
    pzVar5 = s->strm;
    bVar4 = true;
    uVar10 = pzVar5->avail_out - uVar7;
    if (pzVar5->avail_out < uVar7) goto LAB_00601635;
    uVar2 = (uInt)s->block_start;
    uVar3 = s->strstart;
    uVar13 = uVar3 - uVar2;
    uVar8 = pzVar5->avail_in + uVar13;
    uVar7 = 0xffff;
    if ((ulong)pzVar5->avail_in + (ulong)uVar13 < 0xffff) {
      uVar7 = uVar8;
    }
    if (uVar10 <= uVar7) {
      uVar7 = uVar10;
    }
    if ((uVar7 < uVar12) && (((flush != 4 && uVar7 == 0 || (uVar7 != uVar8)) || (flush == 0))))
    goto LAB_00601635;
    bVar4 = uVar8 == uVar7;
    cm_zlib__tr_stored_block(s,(charf *)0x0,0,(uint)(bVar4 && flush == 4));
    s->pending_buf[s->pending - 4] = (Bytef)uVar7;
    s->pending_buf[s->pending - 3] = (Bytef)(uVar7 >> 8);
    s->pending_buf[s->pending - 2] = (Bytef)~uVar7;
    s->pending_buf[s->pending - 1] = (Bytef)(~uVar7 >> 8);
    flush_pending(s->strm);
    if (uVar3 != uVar2) {
      if (uVar7 <= uVar13) {
        uVar13 = uVar7;
      }
      uVar9 = (ulong)uVar13;
      memcpy(s->strm->next_out,s->window + s->block_start,uVar9);
      pzVar5 = s->strm;
      pzVar5->next_out = pzVar5->next_out + uVar9;
      pzVar5->avail_out = pzVar5->avail_out - uVar13;
      pzVar5->total_out = pzVar5->total_out + uVar9;
      s->block_start = s->block_start + uVar9;
      uVar7 = uVar7 - uVar13;
    }
    if (uVar7 != 0) {
      read_buf(s->strm,s->strm->next_out,uVar7);
      pzVar5 = s->strm;
      pzVar5->next_out = pzVar5->next_out + uVar7;
      pzVar5->avail_out = pzVar5->avail_out - uVar7;
      pzVar5->total_out = pzVar5->total_out + (ulong)uVar7;
    }
  } while (!bVar4 || flush != 4);
  pzVar5 = s->strm;
  bVar4 = false;
LAB_00601635:
  uVar12 = uVar1 - pzVar5->avail_in;
  if (uVar12 == 0) {
    uVar7 = s->strstart;
    uVar9 = (ulong)uVar7;
  }
  else {
    uVar7 = s->w_size;
    uVar9 = (ulong)uVar7;
    if (uVar12 < uVar7) {
      uVar6 = (ulong)s->strstart;
      __n = (ulong)uVar12;
      if (s->window_size - uVar6 <= __n) {
        uVar7 = s->strstart - uVar7;
        s->strstart = uVar7;
        memcpy(s->window,s->window + uVar9,(ulong)uVar7);
        if (s->matches < 2) {
          s->matches = s->matches + 1;
        }
        uVar7 = s->strstart;
        uVar6 = (ulong)uVar7;
        if (uVar7 < s->insert) {
          s->insert = uVar7;
        }
      }
      memcpy(s->window + uVar6,s->strm->next_in + -__n,__n);
      uVar7 = s->strstart + uVar12;
      s->strstart = uVar7;
      uVar10 = s->w_size - s->insert;
      if (uVar12 < uVar10) {
        uVar10 = uVar12;
      }
      s->insert = uVar10 + s->insert;
    }
    else {
      s->matches = 2;
      memcpy(s->window,pzVar5->next_in + -uVar9,uVar9);
      uVar7 = s->w_size;
      s->strstart = uVar7;
      s->insert = uVar7;
    }
    uVar9 = (ulong)uVar7;
    s->block_start = uVar9;
  }
  if (s->high_water < uVar9) {
    s->high_water = uVar9;
  }
  if (bVar4) {
    if ((((flush & 0xfffffffbU) == 0) || (s->strm->avail_in != 0)) || (s->block_start != uVar9)) {
      uVar12 = (int)s->window_size - uVar7;
      if (uVar12 < s->strm->avail_in) {
        uVar9 = (ulong)s->w_size;
        if ((long)uVar9 <= s->block_start) {
          s->block_start = s->block_start - uVar9;
          uVar7 = uVar7 - s->w_size;
          s->strstart = uVar7;
          memcpy(s->window,s->window + uVar9,(ulong)uVar7);
          if (s->matches < 2) {
            s->matches = s->matches + 1;
          }
          uVar12 = uVar12 + s->w_size;
          uVar7 = s->strstart;
          if (uVar7 < s->insert) {
            s->insert = uVar7;
          }
        }
      }
      uVar10 = s->strm->avail_in;
      if (uVar12 < uVar10) {
        uVar10 = uVar12;
      }
      if (uVar10 != 0) {
        read_buf(s->strm,s->window + uVar7,uVar10);
        uVar7 = s->strstart + uVar10;
        s->strstart = uVar7;
        uVar12 = s->w_size - s->insert;
        if (uVar10 < uVar12) {
          uVar12 = uVar10;
        }
        s->insert = uVar12 + s->insert;
      }
      if (s->high_water < (ulong)uVar7) {
        s->high_water = (ulong)uVar7;
      }
      uVar9 = s->pending_buf_size - (ulong)(uint)(s->bi_valid + 0x2a >> 3);
      if (0xfffe < uVar9) {
        uVar9 = 0xffff;
      }
      uVar10 = (uint)uVar9;
      uVar12 = s->w_size;
      if (uVar10 <= s->w_size) {
        uVar12 = uVar10;
      }
      uVar8 = (uint)s->block_start;
      uVar13 = uVar7 - uVar8;
      if (uVar13 < uVar12) {
        if (flush == 0) {
          return need_more;
        }
        if (flush != 4 && uVar7 == uVar8) {
          return need_more;
        }
        if (s->strm->avail_in != 0) {
          return need_more;
        }
      }
      uVar12 = uVar10;
      if (uVar13 < uVar10) {
        uVar12 = uVar13;
      }
      uVar7 = 0;
      if ((flush == 4) && (s->strm->avail_in == 0)) {
        uVar7 = (uint)(uVar13 <= uVar10);
      }
      cm_zlib__tr_stored_block(s,(charf *)(s->window + s->block_start),(ulong)uVar12,uVar7);
      s->block_start = s->block_start + (ulong)uVar12;
      flush_pending(s->strm);
      bVar11 = uVar7 * 2;
    }
    else {
      bVar11 = block_done;
    }
  }
  else {
    bVar11 = finish_done;
  }
  return bVar11;
}

Assistant:

local block_state deflate_stored(deflate_state *s, int flush) {
    /* Smallest worthy block size when not flushing or finishing. By default
     * this is 32K. This can be as small as 507 bytes for memLevel == 1. For
     * large input and output buffers, the stored block size will be larger.
     */
    unsigned min_block = MIN(s->pending_buf_size - 5, s->w_size);

    /* Copy as many min_block or larger stored blocks directly to next_out as
     * possible. If flushing, copy the remaining available input to next_out as
     * stored blocks, if there is enough space.
     */
    unsigned len, left, have, last = 0;
    unsigned used = s->strm->avail_in;
    do {
        /* Set len to the maximum size block that we can copy directly with the
         * available input data and output space. Set left to how much of that
         * would be copied from what's left in the window.
         */
        len = MAX_STORED;       /* maximum deflate stored block length */
        have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        if (s->strm->avail_out < have)          /* need room for header */
            break;
            /* maximum stored block length that will fit in avail_out: */
        have = s->strm->avail_out - have;
        left = s->strstart - s->block_start;    /* bytes left in window */
        if (len > (ulg)left + s->strm->avail_in)
            len = left + s->strm->avail_in;     /* limit len to the input */
        if (len > have)
            len = have;                         /* limit len to the output */

        /* If the stored block would be less than min_block in length, or if
         * unable to copy all of the available input when flushing, then try
         * copying to the window and the pending buffer instead. Also don't
         * write an empty block when flushing -- deflate() does that.
         */
        if (len < min_block && ((len == 0 && flush != Z_FINISH) ||
                                flush == Z_NO_FLUSH ||
                                len != left + s->strm->avail_in))
            break;

        /* Make a dummy stored block in pending to get the header bytes,
         * including any pending bits. This also updates the debugging counts.
         */
        last = flush == Z_FINISH && len == left + s->strm->avail_in ? 1 : 0;
        _tr_stored_block(s, (char *)0, 0L, last);

        /* Replace the lengths in the dummy stored block with len. */
        s->pending_buf[s->pending - 4] = len;
        s->pending_buf[s->pending - 3] = len >> 8;
        s->pending_buf[s->pending - 2] = ~len;
        s->pending_buf[s->pending - 1] = ~len >> 8;

        /* Write the stored block header bytes. */
        flush_pending(s->strm);

#ifdef ZLIB_DEBUG
        /* Update debugging counts for the data about to be copied. */
        s->compressed_len += len << 3;
        s->bits_sent += len << 3;
#endif

        /* Copy uncompressed bytes from the window to next_out. */
        if (left) {
            if (left > len)
                left = len;
            zmemcpy(s->strm->next_out, s->window + s->block_start, left);
            s->strm->next_out += left;
            s->strm->avail_out -= left;
            s->strm->total_out += left;
            s->block_start += left;
            len -= left;
        }

        /* Copy uncompressed bytes directly from next_in to next_out, updating
         * the check value.
         */
        if (len) {
            read_buf(s->strm, s->strm->next_out, len);
            s->strm->next_out += len;
            s->strm->avail_out -= len;
            s->strm->total_out += len;
        }
    } while (last == 0);

    /* Update the sliding window with the last s->w_size bytes of the copied
     * data, or append all of the copied data to the existing window if less
     * than s->w_size bytes were copied. Also update the number of bytes to
     * insert in the hash tables, in the event that deflateParams() switches to
     * a non-zero compression level.
     */
    used -= s->strm->avail_in;      /* number of input bytes directly copied */
    if (used) {
        /* If any input was used, then no unused input remains in the window,
         * therefore s->block_start == s->strstart.
         */
        if (used >= s->w_size) {    /* supplant the previous history */
            s->matches = 2;         /* clear hash */
            zmemcpy(s->window, s->strm->next_in - s->w_size, s->w_size);
            s->strstart = s->w_size;
            s->insert = s->strstart;
        }
        else {
            if (s->window_size - s->strstart <= used) {
                /* Slide the window down. */
                s->strstart -= s->w_size;
                zmemcpy(s->window, s->window + s->w_size, s->strstart);
                if (s->matches < 2)
                    s->matches++;   /* add a pending slide_hash() */
                if (s->insert > s->strstart)
                    s->insert = s->strstart;
            }
            zmemcpy(s->window + s->strstart, s->strm->next_in - used, used);
            s->strstart += used;
            s->insert += MIN(used, s->w_size - s->insert);
        }
        s->block_start = s->strstart;
    }
    if (s->high_water < s->strstart)
        s->high_water = s->strstart;

    /* If the last block was written to next_out, then done. */
    if (last)
        return finish_done;

    /* If flushing and all input has been consumed, then done. */
    if (flush != Z_NO_FLUSH && flush != Z_FINISH &&
        s->strm->avail_in == 0 && (long)s->strstart == s->block_start)
        return block_done;

    /* Fill the window with any remaining input. */
    have = s->window_size - s->strstart;
    if (s->strm->avail_in > have && s->block_start >= (long)s->w_size) {
        /* Slide the window down. */
        s->block_start -= s->w_size;
        s->strstart -= s->w_size;
        zmemcpy(s->window, s->window + s->w_size, s->strstart);
        if (s->matches < 2)
            s->matches++;           /* add a pending slide_hash() */
        have += s->w_size;          /* more space now */
        if (s->insert > s->strstart)
            s->insert = s->strstart;
    }
    if (have > s->strm->avail_in)
        have = s->strm->avail_in;
    if (have) {
        read_buf(s->strm, s->window + s->strstart, have);
        s->strstart += have;
        s->insert += MIN(have, s->w_size - s->insert);
    }
    if (s->high_water < s->strstart)
        s->high_water = s->strstart;

    /* There was not enough avail_out to write a complete worthy or flushed
     * stored block to next_out. Write a stored block to pending instead, if we
     * have enough input for a worthy block, or if flushing and there is enough
     * room for the remaining input as a stored block in the pending buffer.
     */
    have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        /* maximum stored block length that will fit in pending: */
    have = MIN(s->pending_buf_size - have, MAX_STORED);
    min_block = MIN(have, s->w_size);
    left = s->strstart - s->block_start;
    if (left >= min_block ||
        ((left || flush == Z_FINISH) && flush != Z_NO_FLUSH &&
         s->strm->avail_in == 0 && left <= have)) {
        len = MIN(left, have);
        last = flush == Z_FINISH && s->strm->avail_in == 0 &&
               len == left ? 1 : 0;
        _tr_stored_block(s, (charf *)s->window + s->block_start, len, last);
        s->block_start += len;
        flush_pending(s->strm);
    }

    /* We've done all we can with the available input and output. */
    return last ? finish_started : need_more;
}